

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageBase.cpp
# Opt level: O1

void __thiscall MessageBase::warning(MessageBase *this,string *message)

{
  spdlog::logger::log((this->logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0.0);
  return;
}

Assistant:

void MessageBase::warning(const std::string& message) { logger->warn(message); }